

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O2

string * __thiscall
mocker::nasm::fmtAddr_abi_cxx11_
          (string *__return_storage_ptr__,nasm *this,shared_ptr<mocker::nasm::Addr> *addr)

{
  shared_ptr<mocker::nasm::Addr> *addr_00;
  shared_ptr<mocker::nasm::Addr> *addr_01;
  int __val;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  shared_ptr<mocker::nasm::NumericConstant> p;
  shared_ptr<mocker::nasm::MemoryAddr> p_2;
  shared_ptr<mocker::nasm::LabelAddr> p_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  __shared_ptr<mocker::nasm::Addr,(__gnu_cxx::_Lock_policy)2> local_68 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  string local_58;
  string local_38;
  
  std::dynamic_pointer_cast<mocker::nasm::NumericConstant,mocker::nasm::Addr>
            ((shared_ptr<mocker::nasm::Addr> *)&p);
  if (p.super___shared_ptr<mocker::nasm::NumericConstant,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p.super___shared_ptr<mocker::nasm::NumericConstant,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::dynamic_pointer_cast<mocker::nasm::Register,mocker::nasm::Addr>
              ((shared_ptr<mocker::nasm::Addr> *)&p);
    if (p.super___shared_ptr<mocker::nasm::NumericConstant,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&p.super___shared_ptr<mocker::nasm::NumericConstant,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::dynamic_pointer_cast<mocker::nasm::MemoryAddr,mocker::nasm::Addr>
                ((shared_ptr<mocker::nasm::Addr> *)&p_2);
      if (p_2.super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&p,"[",(allocator<char> *)&p_4)
        ;
        if (((p_2.super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            reg1).super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::__shared_ptr<mocker::nasm::Addr,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<mocker::nasm::Register,void>
                    ((__shared_ptr<mocker::nasm::Addr,(__gnu_cxx::_Lock_policy)2> *)&local_88,
                     &((p_2.super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->reg1).
                      super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>);
          fmtAddr_abi_cxx11_((string *)&p_4,(nasm *)&local_88,addr_00);
          std::__cxx11::string::append((string *)&p);
          std::__cxx11::string::~string((string *)&p_4);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88._M_string_length);
        }
        if (((p_2.super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            reg2).super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          if (p.super___shared_ptr<mocker::nasm::NumericConstant,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1) {
            std::__cxx11::string::append((char *)&p);
          }
          std::__shared_ptr<mocker::nasm::Addr,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<mocker::nasm::Register,void>
                    (local_68,&((p_2.
                                 super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->reg2).
                               super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                    );
          fmtAddr_abi_cxx11_(&local_38,(nasm *)local_68,addr_01);
          std::operator+(&local_88,&local_38,"*");
          std::__cxx11::to_string
                    (&local_58,
                     (p_2.super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->scale);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_4,
                         &local_88,&local_58);
          std::__cxx11::string::append((string *)&p);
          std::__cxx11::string::~string((string *)&p_4);
          std::__cxx11::string::~string((string *)&local_58);
          std::__cxx11::string::~string((string *)&local_88);
          std::__cxx11::string::~string((string *)&local_38);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
        }
        __val = (int)(p_2.super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->number;
        if (__val != 0) {
          if (0 < __val) {
            std::__cxx11::string::append((char *)&p);
            __val = (int)(p_2.
                          super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->number;
          }
          std::__cxx11::to_string((string *)&p_4,__val);
          std::__cxx11::string::append((string *)&p);
          std::__cxx11::string::~string((string *)&p_4);
        }
        std::operator+(__return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,"]");
        std::__cxx11::string::~string((string *)&p);
        this_00 = &p_2.super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
        goto LAB_00191209;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&p_2.super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::dynamic_pointer_cast<mocker::nasm::Label,mocker::nasm::Addr>
                ((shared_ptr<mocker::nasm::Addr> *)&p);
      if (p.super___shared_ptr<mocker::nasm::NumericConstant,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&p.super___shared_ptr<mocker::nasm::NumericConstant,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::dynamic_pointer_cast<mocker::nasm::LabelAddr,mocker::nasm::Addr>
                  ((shared_ptr<mocker::nasm::Addr> *)&p_4);
        if (p_4.super___shared_ptr<mocker::nasm::LabelAddr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&p_4.super___shared_ptr<mocker::nasm::LabelAddr,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/nasm/src/printer.cpp"
                        ,0x35,"std::string mocker::nasm::fmtAddr(const std::shared_ptr<Addr> &)");
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,"[",
                       &(p_4.super___shared_ptr<mocker::nasm::LabelAddr,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->labelName);
        std::operator+(__return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,"]");
        std::__cxx11::string::~string((string *)&p);
        this_00 = &p_4.super___shared_ptr<mocker::nasm::LabelAddr,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
        goto LAB_00191209;
      }
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,
                 (string *)
                 &(p.super___shared_ptr<mocker::nasm::NumericConstant,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->val);
    }
    else {
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,
                 (string *)
                 &(p.super___shared_ptr<mocker::nasm::NumericConstant,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->val);
    }
  }
  else {
    std::__cxx11::to_string
              (__return_storage_ptr__,
               (p.super___shared_ptr<mocker::nasm::NumericConstant,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->val);
  }
  this_00 = &p.super___shared_ptr<mocker::nasm::NumericConstant,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
LAB_00191209:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
  return __return_storage_ptr__;
}

Assistant:

std::string fmtAddr(const std::shared_ptr<Addr> &addr) {
  if (auto p = dyc<NumericConstant>(addr))
    return std::to_string(p->getVal());
  if (auto p = dyc<Register>(addr))
    return p->getIdentifier();
  if (auto p = dyc<MemoryAddr>(addr)) {
    std::string res = "[";
    if (p->getReg1())
      res += fmtAddr(p->getReg1());
    if (p->getReg2()) {
      if (res.size() != 1)
        res += "+";
      res += fmtAddr(p->getReg2()) + "*" + std::to_string(p->getScale());
    }
    if (p->getNumber() != 0) {
      if (p->getNumber() > 0)
        res += "+";
      res += std::to_string(p->getNumber());
    }
    return res + "]";
  }
  if (auto p = dyc<Label>(addr)) {
    return p->getName();
  }
  if (auto p = dyc<LabelAddr>(addr)) {
    return "[" + p->getLabelName() + "]";
  }
  assert(false);
}